

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_equal(lua_State *L,int idx1,int idx2)

{
  double dVar1;
  double dVar2;
  TValue *pTVar3;
  TValue *pTVar4;
  TValue *pTVar5;
  ulong uVar6;
  
  pTVar3 = index2adr(L,idx1);
  pTVar4 = index2adr(L,idx2);
  dVar1 = (double)pTVar3->u64;
  dVar2 = (double)pTVar4->u64;
  if ((uint)((ulong)dVar2 >> 0x2f) < 0x1fff3 && (uint)((ulong)dVar1 >> 0x2f) < 0x1fff3) {
    pTVar5 = (TValue *)(ulong)(-(uint)(dVar1 == dVar2) & 1);
  }
  else {
    uVar6 = (long)dVar1 >> 0x2f;
    pTVar5 = (TValue *)0x0;
    if (uVar6 == (long)dVar2 >> 0x2f) {
      if (uVar6 < 0xfffffffffffffffd) {
        if (dVar1 == dVar2) {
          pTVar5 = (TValue *)0x1;
        }
        else {
          pTVar5 = (TValue *)0x0;
          if (uVar6 < 0xfffffffffffffff5) {
            pTVar5 = lj_meta_equal(L,(GCobj *)((ulong)dVar1 & 0x7fffffffffff),
                                   (GCobj *)((ulong)dVar2 & 0x7fffffffffff),0);
            if ((TValue *)0x1 < pTVar5) {
              L->top = pTVar5 + 2;
              lj_vm_call(L,pTVar5,2);
              pTVar3 = L->top;
              L->top = pTVar3 + -3;
              pTVar5 = (TValue *)(ulong)(*(short *)((long)pTVar3 + -2) != -1);
            }
          }
        }
      }
      else {
        pTVar5 = (TValue *)((L->glref).ptr64 + 0xf8);
        pTVar5 = (TValue *)(ulong)(pTVar4 != pTVar5 && pTVar3 != pTVar5);
      }
    }
  }
  return (int)pTVar5;
}

Assistant:

LUA_API int lua_equal(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  if (tvisint(o1) && tvisint(o2)) {
    return intV(o1) == intV(o2);
  } else if (tvisnumber(o1) && tvisnumber(o2)) {
    return numberVnum(o1) == numberVnum(o2);
  } else if (itype(o1) != itype(o2)) {
    return 0;
  } else if (tvispri(o1)) {
    return o1 != niltv(L) && o2 != niltv(L);
#if LJ_64 && !LJ_GC64
  } else if (tvislightud(o1)) {
    return o1->u64 == o2->u64;
#endif
  } else if (gcrefeq(o1->gcr, o2->gcr)) {
    return 1;
  } else if (!tvistabud(o1)) {
    return 0;
  } else {
    TValue *base = lj_meta_equal(L, gcV(o1), gcV(o2), 0);
    if ((uintptr_t)base <= 1) {
      return (int)(uintptr_t)base;
    } else {
      L->top = base+2;
      lj_vm_call(L, base, 1+1);
      L->top -= 2+LJ_FR2;
      return tvistruecond(L->top+1+LJ_FR2);
    }
  }
}